

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

void pybind11::detail::all_type_info_populate
               (PyTypeObject *t,
               vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
               *bases)

{
  pointer *ppptVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  type_info **pptVar5;
  iterator __position;
  type_info *ptVar6;
  tuple_iterator tVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __hash_code __code;
  type_info **pptVar10;
  bool bVar11;
  ulong uVar12;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range5;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  __node_base_ptr p_Var15;
  sequence_fast_readonly sVar16;
  ulong uVar17;
  type_info *tinfo;
  vector<_typeobject_*,_std::allocator<_typeobject_*>_> check;
  handle local_60;
  void *local_58;
  long lStack_50;
  long local_48;
  _typeobject *local_40;
  internals *local_38;
  
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  local_60.m_ptr = t->tp_bases;
  if ((type_info *)local_60.m_ptr != (type_info *)0x0) {
    ((type_info *)local_60.m_ptr)->type =
         (PyTypeObject *)
         ((long)&(((type_info *)local_60.m_ptr)->type->ob_base).ob_base.ob_refcnt + 1);
  }
  sVar16.ptr = (PyObject **)&((type_info *)local_60.m_ptr)->type_align;
  if (((byte)((type_info *)local_60.m_ptr)->cpptype[0xab] & 2) != 0) {
    sVar16.ptr = (PyObject **)*sVar16.ptr;
  }
  tVar7 = tuple::end((tuple *)&local_60);
  if ((sequence_fast_readonly)sVar16.ptr != tVar7.super_sequence_fast_readonly.ptr) {
    do {
      local_40 = (_typeobject *)*sVar16.ptr;
      std::vector<_typeobject*,std::allocator<_typeobject*>>::emplace_back<_typeobject*>
                ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,&local_40);
      sVar16.ptr = sVar16.ptr + 1;
    } while ((sequence_fast_readonly)sVar16.ptr != tVar7.super_sequence_fast_readonly.ptr);
  }
  object::~object((object *)&local_60);
  local_38 = get_internals();
  if (lStack_50 - (long)local_58 != 0) {
    uVar14 = lStack_50 - (long)local_58 >> 3;
    uVar17 = 0;
    do {
      p_Var13 = *(_Hash_node_base **)((long)local_58 + uVar17 * 8);
      if (((ulong)p_Var13[1]._M_nxt[0x15]._M_nxt & 0x80000000) != 0) {
        uVar2 = (local_38->registered_types_py)._M_h._M_bucket_count;
        uVar12 = (ulong)p_Var13 % uVar2;
        p_Var3 = (local_38->registered_types_py)._M_h._M_buckets[uVar12];
        p_Var8 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var8 = p_Var3, p_Var15 = p_Var3->_M_nxt, p_Var13 != p_Var3->_M_nxt[1]._M_nxt)) {
          while (p_Var9 = p_Var15->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
            p_Var8 = (__node_base_ptr)0x0;
            if (((ulong)p_Var9[1]._M_nxt % uVar2 != uVar12) ||
               (p_Var8 = p_Var15, p_Var15 = p_Var9, p_Var13 == p_Var9[1]._M_nxt)) goto LAB_0010a4e9;
          }
          p_Var8 = (__node_base_ptr)0x0;
        }
LAB_0010a4e9:
        if (p_Var8 == (__node_base_ptr)0x0) {
          p_Var9 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var9 = p_Var8->_M_nxt;
        }
        if (p_Var9 == (_Hash_node_base *)0x0) {
          ptVar6 = (type_info *)p_Var13[0x2a]._M_nxt;
          if (ptVar6 != (type_info *)0x0) {
            if (uVar17 + 1 == uVar14) {
              lStack_50 = lStack_50 + -8;
              uVar17 = uVar17 - 1;
            }
            ptVar6->type = (PyTypeObject *)((long)&(ptVar6->type->ob_base).ob_base.ob_refcnt + 1);
            sVar16.ptr = (PyObject **)&ptVar6->type_align;
            if (((byte)ptVar6->cpptype[0xab] & 2) != 0) {
              sVar16.ptr = (PyObject **)*sVar16.ptr;
            }
            local_60.m_ptr = (PyObject *)ptVar6;
            tVar7 = tuple::end((tuple *)&local_60);
            for (; (sequence_fast_readonly)sVar16.ptr != tVar7.super_sequence_fast_readonly.ptr;
                sVar16.ptr = sVar16.ptr + 1) {
              local_40 = (_typeobject *)*sVar16.ptr;
              std::vector<_typeobject*,std::allocator<_typeobject*>>::emplace_back<_typeobject*>
                        ((vector<_typeobject*,std::allocator<_typeobject*>> *)&local_58,&local_40);
            }
            object::~object((object *)&local_60);
          }
        }
        else {
          p_Var4 = p_Var9[3]._M_nxt;
          for (p_Var13 = p_Var9[2]._M_nxt; p_Var13 != p_Var4; p_Var13 = p_Var13 + 1) {
            local_60.m_ptr = (PyObject *)p_Var13->_M_nxt;
            pptVar5 = (bases->
                      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            __position._M_current =
                 (bases->
                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (pptVar5 == __position._M_current) {
LAB_0010a544:
              if (__position._M_current ==
                  (bases->
                  super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>::
                _M_realloc_insert<pybind11::detail::type_info*const&>
                          ((vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>
                            *)bases,__position,(type_info **)&local_60);
              }
              else {
                *__position._M_current = (type_info *)local_60.m_ptr;
                ppptVar1 = &(bases->
                            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                *ppptVar1 = *ppptVar1 + 1;
              }
            }
            else {
              do {
                pptVar10 = pptVar5 + 1;
                bVar11 = false;
                if (*pptVar5 == (type_info *)local_60.m_ptr) {
                  bVar11 = true;
                  break;
                }
                pptVar5 = pptVar10;
              } while (pptVar10 != __position._M_current);
              if (!bVar11) goto LAB_0010a544;
            }
          }
        }
      }
      uVar17 = uVar17 + 1;
      uVar14 = lStack_50 - (long)local_58 >> 3;
    } while (uVar17 < uVar14);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE inline void all_type_info_populate(PyTypeObject *t, std::vector<type_info *> &bases) {
    std::vector<PyTypeObject *> check;
    for (handle parent : reinterpret_borrow<tuple>(t->tp_bases))
        check.push_back((PyTypeObject *) parent.ptr());

    auto const &type_dict = get_internals().registered_types_py;
    for (size_t i = 0; i < check.size(); i++) {
        auto type = check[i];
        // Ignore Python2 old-style class super type:
        if (!PyType_Check((PyObject *) type)) continue;

        // Check `type` in the current set of registered python types:
        auto it = type_dict.find(type);
        if (it != type_dict.end()) {
            // We found a cache entry for it, so it's either pybind-registered or has pre-computed
            // pybind bases, but we have to make sure we haven't already seen the type(s) before: we
            // want to follow Python/virtual C++ rules that there should only be one instance of a
            // common base.
            for (auto *tinfo : it->second) {
                // NB: Could use a second set here, rather than doing a linear search, but since
                // having a large number of immediate pybind11-registered types seems fairly
                // unlikely, that probably isn't worthwhile.
                bool found = false;
                for (auto *known : bases) {
                    if (known == tinfo) { found = true; break; }
                }
                if (!found) bases.push_back(tinfo);
            }
        }
        else if (type->tp_bases) {
            // It's some python type, so keep follow its bases classes to look for one or more
            // registered types
            if (i + 1 == check.size()) {
                // When we're at the end, we can pop off the current element to avoid growing
                // `check` when adding just one base (which is typical--i.e. when there is no
                // multiple inheritance)
                check.pop_back();
                i--;
            }
            for (handle parent : reinterpret_borrow<tuple>(type->tp_bases))
                check.push_back((PyTypeObject *) parent.ptr());
        }
    }
}